

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void * AllocUnits(CPpmd7 *p,uint indx)

{
  uint uVar1;
  void *retVal;
  UInt32 numBytes;
  uint indx_local;
  CPpmd7 *p_local;
  
  if (p->FreeList[indx] == 0) {
    uVar1 = (uint)p->Indx2Units[indx] * 0xc;
    if ((uint)((int)p->HiUnit - (int)p->LoUnit) < uVar1) {
      p_local = (CPpmd7 *)AllocUnitsRare(p,indx);
    }
    else {
      p_local = (CPpmd7 *)p->LoUnit;
      p->LoUnit = p->LoUnit + uVar1;
    }
  }
  else {
    p_local = (CPpmd7 *)RemoveNode(p,indx);
  }
  return p_local;
}

Assistant:

static void *AllocUnits(CPpmd7 *p, unsigned indx)
{
  UInt32 numBytes;
  if (p->FreeList[indx] != 0)
    return RemoveNode(p, indx);
  numBytes = U2B(I2U(indx));
  if (numBytes <= (UInt32)(p->HiUnit - p->LoUnit))
  {
    void *retVal = p->LoUnit;
    p->LoUnit += numBytes;
    return retVal;
  }
  return AllocUnitsRare(p, indx);
}